

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

variable_set * __thiscall
merlin::variable_set::operator-
          (variable_set *__return_storage_ptr__,variable_set *this,variable_set *B)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  vsize *pvVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_type __new_size;
  
  variable_set(__return_storage_ptr__,
               (long)(this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  puVar2 = (B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (B->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar4 = this->m_d;
  puVar5 = (__return_storage_ptr__->m_v).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (__return_storage_ptr__->m_dlocal).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  lVar13 = 0;
  lVar11 = 0;
  do {
    lVar12 = 0;
    while( true ) {
      uVar9 = lVar11 + lVar12;
      if ((uVar8 <= uVar9) || ((ulong)((long)puVar3 - (long)puVar2 >> 3) <= uVar10)) {
        pvVar4 = this->m_d;
        puVar2 = (__return_storage_ptr__->m_v).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (__return_storage_ptr__->m_dlocal).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        __new_size = lVar13 + lVar12;
        for (; uVar9 < uVar8; uVar9 = uVar9 + 1) {
          puVar3[__new_size] = pvVar4[uVar9];
          puVar2[__new_size] = puVar1[uVar9];
          __new_size = __new_size + 1;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&__return_storage_ptr__->m_v,__new_size);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  (&__return_storage_ptr__->m_dlocal,__new_size);
        return __return_storage_ptr__;
      }
      uVar9 = puVar2[uVar10];
      if (uVar9 <= puVar1[lVar11 + lVar12]) break;
      puVar6[lVar13 + lVar12] = pvVar4[lVar11 + lVar12];
      puVar5[lVar13 + lVar12] = puVar1[lVar11 + lVar12];
      lVar12 = lVar12 + 1;
    }
    lVar7 = lVar11 + 1;
    if (puVar1[lVar11 + lVar12] != uVar9) {
      lVar7 = lVar11;
    }
    lVar11 = lVar7 + lVar12;
    uVar10 = uVar10 + 1;
    lVar13 = lVar13 + lVar12;
  } while( true );
}

Assistant:

variable_set operator-(const variable_set& B) const {
		variable_set dest(size());
		size_t i, j, k;
		for (i = 0, j = 0, k = 0; i < size() && j < B.size();) {
			if (m_v[i] < B.m_v[j]) {
				dest.m_dlocal[k] = m_d[i];
				dest.m_v[k++] = m_v[i++];
			} else if (m_v[i] == B.m_v[j]) {
				i++;
				j++;
			} else {
				j++;
			}
		}
		while (i < size()) {
			dest.m_dlocal[k] = m_d[i];
			dest.m_v[k++] = m_v[i++];
		}
		dest.m_v.resize(k);
		dest.m_dlocal.resize(k);
		return dest;
	}